

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O3

void __thiscall
hwtest::pgraph::MthdKelvinFdBeginPatchD::adjust_orig_mthd(MthdKelvinFdBeginPatchD *this)

{
  mt19937 *this_00;
  uint32_t *puVar1;
  byte *pbVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  result_type rVar6;
  int iVar7;
  int i;
  long lVar8;
  
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
      chipset.card_type == 0x20) {
    uVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.idx_state_a;
    if ((~uVar3 & 0xf00000) == 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.idx_state_a =
           uVar3 & 0xff0fffff;
    }
    puVar1 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.idx_state_b;
    *puVar1 = *puVar1 & 0xe0e0ffff;
    pbVar2 = (byte *)((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                             debug_d + 3);
    *pbVar2 = *pbVar2 & 0xef;
    pbVar2 = (byte *)((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                             fd_state_unk30 + 1);
    *pbVar2 = *pbVar2 & 0xfb;
    this_00 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.
               super_Test.rnd;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar6 & 1) != 0) {
      pbVar2 = (byte *)((long)&(this->super_SingleMthdTest).super_MthdTest.val + 2);
      *pbVar2 = *pbVar2 & 1;
    }
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar6 & 1) != 0) {
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar6 & 7) != 0) {
        puVar1 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.debug_d;
        *(byte *)puVar1 = (byte)*puVar1 | 8;
      }
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar6 & 7) != 0) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.debug_fd_check_skip = 0;
      }
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar6 & 7) != 0) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fe3d_misc =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fe3d_misc & 0xfeffff0f
             | 0xe0;
      }
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar6 & 3) != 0) {
        *(undefined1 *)((long)&(this->super_SingleMthdTest).super_MthdTest.val + 3) = 0x10;
      }
    }
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar6 & 1) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_begin_patch_c =
           (uint)*(ushort *)
                  ((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                          fd_state_begin_patch_c + 2) << 0x10;
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      puVar1 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                fd_state_begin_patch_c;
      *puVar1 = *puVar1 ^ 1 << ((byte)rVar6 & 0x1f);
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      puVar1 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                fd_state_begin_patch_c;
      *puVar1 = *puVar1 ^ 1 << ((byte)rVar6 & 0x1f);
    }
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar6 & 1) != 0) {
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar6 & 1) != 0) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fe3d_shadow_begin_patch_c =
             (uint)*(ushort *)
                    ((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                            fe3d_shadow_begin_patch_c + 2) << 0x10;
      }
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar6 & 1) != 0) {
        uVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                fe3d_shadow_begin_patch_c;
        rVar6 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(this_00);
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fe3d_shadow_begin_patch_c =
             ((uint)rVar6 & 1) << 0x15 | uVar3 & 0xfc1fffff;
      }
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar6 & 1) != 0) {
        uVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                fe3d_shadow_begin_patch_c;
        rVar6 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(this_00);
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fe3d_shadow_begin_patch_c =
             ((uint)rVar6 & 1) << 0x1a | uVar3 & 0x83ffffff;
      }
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar6 & 1) != 0) {
        rVar6 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(this_00);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = rVar6;
        iVar7 = SUB164(auVar4 * ZEXT816(0x842108421084211),8);
        puVar1 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                  fe3d_shadow_begin_patch_c;
        *puVar1 = *puVar1 ^ 1 << ((char)(((uint)((int)rVar6 - iVar7) >> 1) + iVar7 >> 4) +
                                  (char)rVar6 & 0x1fU);
        rVar6 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(this_00);
        if ((rVar6 & 1) != 0) {
          rVar6 = std::
                  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                  ::operator()(this_00);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = rVar6;
          iVar7 = SUB164(auVar5 * ZEXT816(0x842108421084211),8);
          puVar1 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                    fe3d_shadow_begin_patch_c;
          *puVar1 = *puVar1 ^ 1 << ((char)(((uint)((int)rVar6 - iVar7) >> 1) + iVar7 >> 4) +
                                    (char)rVar6 & 0x1fU);
        }
      }
    }
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar6 & 1) != 0) {
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar6 & 7) != 0) {
        uVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_unk1c;
        rVar6 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(this_00);
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_unk1c =
             (uint)rVar6 & 1 | uVar3 & 0xffffffe0;
      }
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar6 & 7) != 0) {
        uVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_unk20;
        rVar6 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(this_00);
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_unk20 =
             ((uint)rVar6 & 1) << 0x1b | uVar3 & 0x7ffffff;
      }
    }
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar6 & 3) != 0) {
      puVar1 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.ctx_valid;
      *puVar1 = *puVar1 | 0xc0c;
    }
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar6 & 3) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.surf_type =
           ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.surf_type & 0xfffffffc)
           + 1;
    }
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar6 & 0xf) == 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.bundle_dma_tex[0] =
           (uint)*(ushort *)
                  ((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                         bundle_dma_tex + 2) << 0x10;
    }
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar6 & 0xf) == 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.bundle_dma_tex[1] =
           (uint)*(ushort *)
                  ((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                         bundle_dma_tex + 6) << 0x10;
    }
    lVar8 = 0;
    do {
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar6 & 0xf) == 0) {
        rVar6 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(this_00);
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.bundle_tex_format[lVar8] =
             ((byte)"\f\x0e\x0f"[rVar6 % 3] & 0x7f) << 8 |
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.bundle_tex_format
             [lVar8] & 0xffff80ff;
      }
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar6 & 7) != 0) {
        puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                 bundle_tex_control_a + lVar8;
        *(byte *)puVar1 = (byte)*puVar1 & 0xf7;
      }
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar6 & 7) != 0) {
        puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                 bundle_tex_control_a + lVar8;
        *(byte *)puVar1 = (byte)*puVar1 & 0xcf;
      }
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar6 & 7) != 0) {
        pbVar2 = (byte *)((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                                bundle_tex_control_a + lVar8 * 4 + 3);
        *pbVar2 = *pbVar2 | 0x40;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    lVar8 = 0;
    do {
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar6 & 7) != 0) {
        pbVar2 = (byte *)((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                                bundle_rc_out_color + lVar8 * 4 + 2);
        *pbVar2 = *pbVar2 & 0xf3;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar6 & 1) != 0) {
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar6 & 7) != 0) {
        puVar1 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.bundle_stencil_a;
        *(byte *)puVar1 = (byte)*puVar1 & 0xfe;
      }
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar6 & 7) != 0) {
        puVar1 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.bundle_blend;
        *(byte *)puVar1 = (byte)*puVar1 & 0xf7;
      }
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar6 & 7) != 0) {
        pbVar2 = (byte *)((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                                 bundle_config_a + 1);
        *pbVar2 = *pbVar2 & 0xbf;
      }
    }
  }
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (chipset.card_type != 0x20)
			return;
		adjust_orig_idx(&orig);
		// Prevents things from blowing up...
		insrt(orig.fd_state_unk30, 10, 1, 0);
		if (rnd() & 1) {
			insrt(val, 17, 7, 0);
		}
		if (rnd() & 1) {
			if (rnd() & 7)
				insrt(orig.debug_d, 3, 1, 1);
			if (rnd() & 7)
				orig.debug_fd_check_skip = 0;
			if (rnd() & 7) {
				orig.fe3d_misc &= 0xfeffff0f;
				orig.fe3d_misc |= 0x000000e0;
			}
			if (rnd() & 3) {
				insrt(val, 24, 8, 0x10);
			}
		}
		if (rnd() & 1) {
			orig.fd_state_begin_patch_c &= 0xffff0000;
			orig.fd_state_begin_patch_c ^= 1 << (rnd() & 0x1f);
			orig.fd_state_begin_patch_c ^= 1 << (rnd() & 0x1f);
		}
		if (rnd() & 1) {
			if (rnd() & 1)
				orig.fe3d_shadow_begin_patch_c &= 0xffff0000;
			if (rnd() & 1)
				insrt(orig.fe3d_shadow_begin_patch_c, 21, 5, rnd() & 1);
			if (rnd() & 1)
				insrt(orig.fe3d_shadow_begin_patch_c, 26, 5, rnd() & 1);
			if (rnd() & 1) {
				orig.fe3d_shadow_begin_patch_c ^= 1 << (rnd() % 31);
				if (rnd() & 1)
					orig.fe3d_shadow_begin_patch_c ^= 1 << (rnd() % 31);
			}
		}
		if (rnd() & 1) {
			if (rnd() & 7)
				insrt(orig.fd_state_unk1c, 0, 5, rnd() & 1);
			if (rnd() & 7)
				insrt(orig.fd_state_unk20, 27, 5, rnd() & 1);
		}
		adjust_orig_launch(&orig, rnd);
	}